

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysex.c
# Opt level: O3

void send_sysex(void)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  FILE *__stream;
  int data;
  PmEvent msg;
  PortMidiStream *midi;
  char line [80];
  int local_8c;
  PmEvent local_88;
  undefined8 local_80;
  char local_78 [80];
  
  iVar1 = get_number("Type output device number: ");
  do {
    latency = get_number(
                        "Latency in milliseconds (0 to send data immediatedly,\n  >0 to send timestamped messages): "
                        );
  } while (latency < 0);
  local_88.timestamp = 0;
  Pm_OpenOutput((PortMidiStream **)&local_80,iVar1,(void *)0x0,0,(PmTimeProcPtr)0x0,(void *)0x0,
                latency);
  printf("Midi Output opened, type file with sysex data: ");
  fgets(local_78,0x50,_stdin);
  sVar3 = strlen(local_78);
  if (sVar3 != 0) {
    local_78[sVar3 - 1] = '\0';
  }
  __stream = fopen(local_78,"r");
  if (__stream == (FILE *)0x0) {
    printf("Could not open %s\n",local_78);
  }
  else {
    local_88.message = 0;
    iVar1 = 0;
    do {
      do {
        iVar2 = __isoc99_fscanf(__stream,"%x",&local_8c);
        if (iVar2 == 1) {
          local_88.message = local_88.message | local_8c << ((byte)iVar1 & 0x1f);
          iVar1 = iVar1 + 8;
        }
      } while (local_8c != 0xf7 && iVar1 != 0x20);
      Pm_Write(local_80,&local_88,1);
      local_88.message = 0;
      iVar1 = 0;
    } while (local_8c != 0xf7);
    fclose(__stream);
  }
  Pm_Close(local_80);
  return;
}

Assistant:

void send_sysex()
{
    char line[80];
    FILE *f;
    PmStream *midi;
    int data;
    int shift = 0;
    PmEvent msg;

	/* determine which output device to use */
    int i = get_number("Type output device number: ");
    while ((latency = get_number(
                     "Latency in milliseconds (0 to send data immediatedly,\n"
                     "  >0 to send timestamped messages): ")) < 0);

    msg.timestamp = 0; /* no need for timestamp */

	/* open output device */
    Pm_OpenOutput(&midi, i, NULL, 0, NULL, NULL, latency);
	printf("Midi Output opened, type file with sysex data: ");

    /* open file */
    fgets(line, STRING_MAX, stdin);
    /* remove the newline character */
    if (strlen(line) > 0) line[strlen(line) - 1] = 0;
    f = fopen(line, "r");
    if (!f) {
        printf("Could not open %s\n", line);
        Pm_Close(midi);
        return;
    }

    /* read file and send data */
    msg.message = 0;
    while (1) {
        /* get next byte from file */

        if (fscanf(f, "%x", &data) == 1) {
            /* printf("read %x, ", data); */
            /* OR byte into message at proper offset */
            msg.message |= (data << shift);
            shift += 8;
        }
        /* send the message if it's full (shift == 32) or if we are at end */
        if (shift == 32 || data == MIDI_EOX) {
            /* this will send sysex data 4 bytes at a time -- it would
               be much more efficient to send multiple PmEvents at once
               but this method is simpler. See Pm_WriteSysEx for a more
               efficient code example.
             */
            Pm_Write(midi, &msg, 1);
            msg.message = 0;
            shift = 0;
        }
        if (data == MIDI_EOX) { /* end of message */
            fclose(f);
            Pm_Close(midi);
            return;
        }
    }
}